

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.h
# Opt level: O1

void __thiscall iqxmlrpc::Binary_data::~Binary_data(Binary_data *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Binary_data_0018c038;
  pcVar2 = (this->base64)._M_dataplus._M_p;
  paVar1 = &(this->base64).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->data)._M_dataplus._M_p;
  paVar1 = &(this->data).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

class LIBIQXMLRPC_API Binary_data: public Value_type {
public:
  //! Malformed base64 encoding format exception.
  class Malformed_base64: public Exception {
  public:
    Malformed_base64():
      Exception( "Malformed base64 format." ) {}
  };

private:
  static const char base64_alpha[64];

  std::string data;
  mutable std::string base64;

public:
  //! Construct an object from encoded data.
  static Binary_data* from_base64( const std::string& );
  //! Construct an object from raw data.
  static Binary_data* from_data( const std::string& );
  //! Construct an object from raw data.
  static Binary_data* from_data( const char*, size_t size );

  //! Get data in encoded form.
  const std::string& get_base64() const;
  //! Get raw data.
  const std::string& get_data() const;

  Value_type* clone() const;
  const std::string& type_name() const;
  void apply_visitor( Value_type_visitor& ) const;

private:
  class End_of_data {};

  Binary_data( const std::string&, bool raw );

  void add_base64_char( int idx ) const;
  void encode() const;

  char get_idx( char );
  void decode_four( const std::string& );
  void decode();
}